

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinDeserializer<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_void>
     ::deserialize_elems<InputStream>
               (undefined8 param_1,int param_2,
               unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *param_3
               )

{
  pair<std::__detail::_Node_iterator<int,_true,_false>,_bool> pVar1;
  T elem;
  _Node_iterator_base<int,_false> in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  value_type *in_stack_ffffffffffffffd8;
  undefined4 local_14;
  
  local_14 = param_2;
  while (local_14 != 0) {
    deserialize<int,InputStream>
              ((int *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
               (InputStream *)in_stack_ffffffffffffffc8._M_cur);
    pVar1 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
            insert(param_3,in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffc8._M_cur =
         (__node_type *)pVar1.first.super__Node_iterator_base<int,_false>._M_cur;
    in_stack_ffffffffffffffd0 = pVar1.second;
    local_14 = local_14 + -1;
  }
  return;
}

Assistant:

static void deserialize_elems(
    std::true_type  /* has insert */,
    Sequence& s, std::uint32_t size, InputStream& istream
  )
  {
    // map value_type is pair<const K, V>, we need pair<K, V>
    using T = deep_remove_const_t<typename Sequence::value_type>;

    while (size--)
    {
      T elem;
      mserialize::deserialize(elem, istream);
      s.insert(std::move(elem));
    }
  }